

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arxmlStorage.cpp
# Opt level: O2

void __thiscall lsp::ArxmlStorage::ArxmlStorage(ArxmlStorage *this)

{
  type *ptVar1;
  
  boost::multi_index::
  multi_index_container<lsp::ShortnameElement,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<lsp::tag_fullPathIndex,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::composite_key<lsp::ShortnameElement,_boost::multi_index::const_mem_fun<lsp::ShortnameElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&lsp::ShortnameElement::getFullPath>,_boost::multi_index::member<lsp::ShortnameElement,_unsigned_int,_&lsp::ShortnameElement::fileIndex>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<lsp::tag_offsetIndex,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::composite_key<lsp::ShortnameElement,_boost::multi_index::member<lsp::ShortnameElement,_unsigned_int,_&lsp::ShortnameElement::fileIndex>,_boost::multi_index::member<lsp::ShortnameElement,_unsigned_int,_&lsp::ShortnameElement::charOffset>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<lsp::ShortnameElement>_>
  ::multi_index_container(&this->shortnames_);
  ptVar1 = &(this->shortnames_).super_type;
  this->shortnamesFullPathIndex_ = ptVar1;
  this->shortnamesOffsetIndex_ = (type *)ptVar1;
  std::_Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>::_Deque_base
            (&(this->references_).
              super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>);
  (this->URIs_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->URIs_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->newlineOffsets_).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->URIs_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->newlineOffsets_).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->newlineOffsets_).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

lsp::ArxmlStorage::ArxmlStorage()
    : shortnames_(),
      shortnamesFullPathIndex_{shortnames_.get<tag_fullPathIndex>()},
      shortnamesOffsetIndex_{shortnames_.get<tag_offsetIndex>()}
    {}